

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t
extract_attr_uint8(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,uint8_t *attrdata,
                  char *aname,char *tname,int32_t attrsz,uint8_t maxval)

{
  exr_result_t eVar1;
  
  if (attrsz != 1) {
    eVar1 = (*ctxt->print_error)
                      (ctxt,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size 1)",aname,
                       (ulong)(uint)attrsz,tname);
    return eVar1;
  }
  eVar1 = (*scratch->sequential_read)(scratch,attrdata,1);
  if (eVar1 != 0) {
    eVar1 = (*ctxt->print_error)
                      (ctxt,10,"Unable to read \'%s\' %s data",aname,tname,ctxt->print_error);
    return eVar1;
  }
  if (*attrdata < maxval) {
    eVar1 = 0;
  }
  else {
    eVar1 = (*ctxt->print_error)
                      (ctxt,0xe,"Attribute \'%s\' (type \'%s\'): Invalid value %d (max allowed %d)",
                       aname,tname,(ulong)*attrdata,(uint)maxval);
  }
  return eVar1;
}

Assistant:

static exr_result_t
extract_attr_uint8 (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    uint8_t*                          attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    uint8_t                           maxval)
{
    if (attrsz != 1)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size 1)",
            aname,
            attrsz,
            tname);

    if (scratch->sequential_read (scratch, attrdata, sizeof (uint8_t)))
        return ctxt->print_error (
            ctxt, EXR_ERR_READ_IO, "Unable to read '%s' %s data", aname, tname);

    if (*attrdata >= maxval)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s' (type '%s'): Invalid value %d (max allowed %d)",
            aname,
            tname,
            (int) *attrdata,
            (int) maxval);

    return EXR_ERR_SUCCESS;
}